

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Course.hpp
# Opt level: O3

void __thiscall
Course::Course(Course *this,string *newCourseName,int numUnits,string *newCourseDescription,
              string *newCourseRequisites)

{
  (this->super_CourseComponent).courseName._M_dataplus._M_p =
       (pointer)&(this->super_CourseComponent).courseName.field_2;
  (this->super_CourseComponent).courseName._M_string_length = 0;
  (this->super_CourseComponent).courseName.field_2._M_local_buf[0] = '\0';
  (this->super_CourseComponent).courseDescription._M_dataplus._M_p =
       (pointer)&(this->super_CourseComponent).courseDescription.field_2;
  (this->super_CourseComponent).courseDescription._M_string_length = 0;
  (this->super_CourseComponent).courseDescription.field_2._M_local_buf[0] = '\0';
  (this->super_CourseComponent).taken = false;
  (this->super_CourseComponent).components.
  super__Vector_base<CourseComponent_*,_std::allocator<CourseComponent_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_CourseComponent).components.
  super__Vector_base<CourseComponent_*,_std::allocator<CourseComponent_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_CourseComponent).components.
  super__Vector_base<CourseComponent_*,_std::allocator<CourseComponent_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_CourseComponent).super_Observer._vptr_Observer = (_func_int **)&PTR_update_0010cd30;
  (this->courseRequisites)._M_dataplus._M_p = (pointer)&(this->courseRequisites).field_2;
  (this->courseRequisites)._M_string_length = 0;
  (this->courseRequisites).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)&(this->super_CourseComponent).courseName);
  (this->super_CourseComponent).courseUnits = numUnits;
  std::__cxx11::string::_M_assign((string *)&(this->super_CourseComponent).courseDescription);
  std::__cxx11::string::_M_assign((string *)&this->courseRequisites);
  return;
}

Assistant:

Course(string newCourseName, int numUnits, string newCourseDescription, string newCourseRequisites) : CourseComponent() {
            courseName = newCourseName;
            courseUnits = numUnits;
            courseDescription = newCourseDescription;
            courseRequisites = newCourseRequisites;
        }